

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O2

pair<const_char_*,_unsigned_long> plot::utf8_clamp<char_const*>(char *first,char *last,size_t width)

{
  char32_t __c;
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  pair<const_char_*,_unsigned_long> pVar3;
  
  sVar2 = width;
  while (first != last) {
    __c = detail::utf8_cp<char_const*>(first,last);
    iVar1 = detail::wcwidth(__c);
    if (sVar2 < CONCAT44(extraout_var,iVar1)) break;
    first = detail::utf8_next<char_const*>(first,last);
    sVar2 = sVar2 - CONCAT44(extraout_var,iVar1);
  }
  pVar3.second = width - sVar2;
  pVar3.first = first;
  return pVar3;
}

Assistant:

std::pair<Iterator, std::size_t> utf8_clamp(Iterator first, Iterator last, std::size_t width) {
    std::size_t request = width;

    for (; first != last; first = detail::utf8_next(first, last)) {
        auto cw = detail::wcwidth(detail::utf8_cp(first, last));
        if (cw > width)
            break;
        width -= cw;
    }

    return { first, request - width };
}